

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VANAnalyzer.cpp
# Opt level: O2

void __thiscall
VanAnalyzer::AddFrame
          (VanAnalyzer *this,U64 startingPoint,U64 endingPoint,U32 data,U32 type,U32 indexOfData)

{
  FrameV2 frame_v2;
  Frame frame;
  FrameV2 aFStack_68 [8];
  U64 local_60;
  U64 local_58;
  U64 local_50;
  ulong local_48;
  ulong local_40;
  undefined1 local_38;
  undefined1 local_37;
  
  local_60 = endingPoint;
  Frame::Frame((Frame *)&local_58);
  local_48 = (ulong)data;
  local_40 = (ulong)indexOfData;
  local_37 = 0;
  local_50 = local_60;
  local_58 = startingPoint;
  local_38 = (char)type;
  AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
  FrameV2::FrameV2(aFStack_68);
  if (type == 2) {
    FrameV2::AddByte((char *)aFStack_68,'4');
  }
  else if (type == 1) {
    FrameV2::AddInteger((char *)aFStack_68,0x108029);
    goto LAB_00105fd2;
  }
  FrameV2::AddByte((char *)aFStack_68,'<');
LAB_00105fd2:
  AnalyzerResults::AddFrameV2
            ((FrameV2 *)(this->mResults)._M_ptr,(char *)aFStack_68,
             (ulonglong)this->VanFrameTypeForDisplay[type],local_58);
  AnalyzerResults::CommitResults();
  Analyzer::ReportProgress((ulonglong)this);
  FrameV2::~FrameV2(aFStack_68);
  Frame::~Frame((Frame *)&local_58);
  return;
}

Assistant:

void VanAnalyzer::AddFrame( const U64 startingPoint, const U64 endingPoint, const U32 data, const U32 type, const U32 indexOfData )
{
    Frame frame;
    frame.mData1 = data;
    frame.mData2 = indexOfData;
    frame.mFlags = 0;
    frame.mType = type;
    frame.mStartingSampleInclusive = startingPoint;
    frame.mEndingSampleInclusive = endingPoint;

    mResults->AddFrame( frame );

    FrameV2 frame_v2;

    // you can add any number of key value pairs. Each will get it's own column in the data table.
    if( type == IdentifierField )
    {
        frame_v2.AddInteger( "Identifier", frame.mData1 );
    }
    else if( type == CommandField )
    {
        frame_v2.AddByte( "Command", frame.mData1 );
        frame_v2.AddByte( "Data", frame.mData1 );
    }
    else
    {
        frame_v2.AddByte( "Data", frame.mData1 );
    }

    // The second parameter is the frame "type". Any string is allowed.
    mResults->AddFrameV2( frame_v2, VanFrameTypeForDisplay[ type ], frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );

    mResults->CommitResults();
    ReportProgress( frame.mEndingSampleInclusive );
}